

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

Integer pnga_read_inc(Integer g_a,Integer *subscript,Integer inc)

{
  long lVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  global_array_t *pgVar7;
  Integer IVar8;
  long lVar9;
  int *piVar10;
  C_Integer *pCVar11;
  C_Integer CVar12;
  long lVar13;
  int _ndim;
  long lVar14;
  long *ploc;
  long lVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  char *ptr;
  long lvalue;
  int ivalue;
  Integer ldp [7];
  Integer local_1f8;
  Integer local_1f0;
  long local_1e8;
  char *local_1e0;
  long local_1d8 [7];
  long lStack_1a0;
  undefined8 local_198;
  long local_158;
  long local_150;
  Integer local_148;
  long local_140;
  long local_138 [33];
  
  lVar1 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar1)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","nga_read_inc");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[lVar1].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","nga_read_inc");
    pnga_error((char *)local_138,g_a);
  }
  uVar5 = GA[lVar1].type - 0x3e9;
  if ((0xf < uVar5) || ((0x8003U >> (uVar5 & 0x1f) & 1) == 0)) {
    pnga_error("type must be integer",(long)GA[lVar1].type);
  }
  GAstat.numrdi = GAstat.numrdi + 1;
  GAbytes.rditot = GAbytes.rditot + 8.0;
  local_140 = (long)GA[lVar1].p_handle;
  sVar2 = GA[lVar1].ndim;
  pnga_locate(g_a,subscript,&local_1f8);
  local_150 = (long)sVar2;
  if (GA[lVar1].distr_type != 0) {
    pnga_distribution(g_a,local_1f8,local_1d8,&local_198);
    pnga_access_block_ptr(g_a,local_1f8,&local_1e0,local_138);
    if (sVar2 < 2) {
      lVar6 = 1;
      lVar9 = 0;
    }
    else {
      lVar6 = 1;
      lVar9 = 0;
      lVar14 = 0;
      do {
        lVar9 = lVar9 + (subscript[lVar14] - local_1d8[lVar14]) * lVar6;
        lVar6 = lVar6 * local_138[lVar14];
        lVar14 = lVar14 + 1;
      } while ((long)sVar2 + -1 != lVar14);
    }
    local_1e0 = local_1e0 +
                (long)GA[lVar1].elemsize *
                ((subscript[local_150 + -1] - (long)(&local_1e0)[local_150]) * lVar6 + lVar9);
    goto LAB_00182118;
  }
  pgVar7 = GA + lVar1;
  sVar2 = pgVar7->ndim;
  lVar6 = (long)sVar2;
  local_1e8 = lVar6 + -1;
  local_148 = inc;
  if (pgVar7->num_rstrctd == 0) {
    if (sVar2 < 1) {
      lVar9 = 1;
    }
    else {
      lVar9 = 1;
      lVar14 = 0;
      do {
        lVar9 = lVar9 * GA[g_a + 1000].nblock[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar6 != lVar14);
    }
    if (local_1f8 < 0 || lVar9 <= local_1f8) {
      if (0 < sVar2) {
        local_1f0 = g_a;
        memset(local_1d8,0,lVar6 << 3);
        g_a = local_1f0;
        memset(&local_198,0xff,lVar6 << 3);
      }
    }
    else if (0 < sVar2) {
      pCVar11 = pgVar7->mapc;
      lVar9 = 0;
      lVar14 = 0;
      IVar8 = local_1f8;
      do {
        lVar15 = (long)GA[g_a + 1000].nblock[lVar9];
        lVar13 = IVar8 % lVar15;
        local_1d8[lVar9] = pCVar11[lVar13 + lVar14];
        if (lVar13 == lVar15 + -1) {
          CVar12 = GA[g_a + 1000].dims[lVar9];
        }
        else {
          CVar12 = pCVar11[lVar13 + lVar14 + 1] + -1;
        }
        lVar14 = lVar14 + lVar15;
        (&local_198)[lVar9] = CVar12;
        lVar9 = lVar9 + 1;
        IVar8 = IVar8 / lVar15;
      } while (lVar6 != lVar9);
    }
    lVar9 = local_1e8;
    if (0 < GA[lVar1].ndim) {
      local_158 = lVar6;
      uVar17 = 0;
      local_1f0 = g_a;
      do {
        lVar6 = subscript[uVar17];
        if ((lVar6 < local_1d8[uVar17]) || ((long)(&local_198)[uVar17] < lVar6)) {
          sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d",lVar6,
                  local_1d8[uVar17],(&local_198)[uVar17],uVar17 & 0xffffffff);
          pnga_error((char *)local_138,uVar17);
          lVar9 = local_1e8;
        }
        uVar17 = uVar17 + 1;
        lVar6 = local_158;
        g_a = local_1f0;
      } while ((long)uVar17 < (long)GA[lVar1].ndim);
    }
    pgVar7 = GA + lVar1;
    if (lVar9 == 0) {
      local_138[0] = (CONCAT44(local_198._4_4_,(int)local_198) - local_1d8[0]) +
                     pgVar7->width[0] * 2 + 1;
    }
    if ((short)lVar6 < 2) {
      lVar14 = 1;
      lVar13 = 0;
    }
    else {
      lVar14 = 1;
      lVar13 = 0;
      lVar15 = 0;
      do {
        lVar13 = lVar13 + ((GA[g_a + 1000].width[lVar15] + subscript[lVar15]) - local_1d8[lVar15]) *
                          lVar14;
        lVar16 = ((GA[g_a + 1000].width[lVar15] * 2 + 1) - local_1d8[lVar15]) + (&local_198)[lVar15]
        ;
        local_138[lVar15] = lVar16;
        lVar14 = lVar14 * lVar16;
        lVar15 = lVar15 + 1;
      } while (lVar9 != lVar15);
    }
    lVar13 = ((subscript[lVar6 + -1] - (long)(&local_1e0)[lVar6]) + pgVar7->width[lVar6 + -1]) *
             lVar14 + lVar13;
    if (pgVar7->p_handle == 0) {
      piVar10 = PGRP_LIST->inv_map_proc_list;
      CVar12 = local_1f8;
      goto LAB_001820eb;
    }
    CVar12 = local_1f8;
    if (pgVar7->num_rstrctd != 0) {
      pCVar11 = pgVar7->rstrctd_list;
      goto LAB_001820fc;
    }
  }
  else {
    if (pgVar7->rank_rstrctd[local_1f8] < pgVar7->num_rstrctd) {
      if (sVar2 < 1) {
        lVar9 = 1;
      }
      else {
        lVar9 = 1;
        lVar14 = 0;
        do {
          lVar9 = lVar9 * GA[g_a + 1000].nblock[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar6 != lVar14);
      }
      lVar14 = GA[lVar1].rank_rstrctd[local_1f8];
      if (lVar14 < 0 || lVar9 <= lVar14) goto LAB_00181eb7;
      if (0 < sVar2) {
        pCVar11 = pgVar7->mapc;
        lVar9 = 0;
        lVar13 = 0;
        do {
          lVar16 = (long)GA[g_a + 1000].nblock[lVar13];
          lVar15 = lVar14 % lVar16;
          local_1d8[lVar13] = pCVar11[lVar15 + lVar9];
          if (lVar15 == lVar16 + -1) {
            CVar12 = GA[g_a + 1000].dims[lVar13];
          }
          else {
            CVar12 = pCVar11[lVar15 + lVar9 + 1] + -1;
          }
          lVar9 = lVar9 + lVar16;
          (&local_198)[lVar13] = CVar12;
          lVar13 = lVar13 + 1;
          lVar14 = lVar14 / lVar16;
        } while (lVar6 != lVar13);
      }
    }
    else {
LAB_00181eb7:
      if (0 < sVar2) {
        local_1f0 = g_a;
        memset(local_1d8,0,lVar6 << 3);
        g_a = local_1f0;
        memset(&local_198,0xff,lVar6 << 3);
      }
    }
    lVar9 = local_1e8;
    if (0 < GA[lVar1].ndim) {
      local_158 = lVar6;
      uVar17 = 0;
      local_1f0 = g_a;
      do {
        lVar6 = subscript[uVar17];
        if ((lVar6 < local_1d8[uVar17]) || ((long)(&local_198)[uVar17] < lVar6)) {
          sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d",lVar6,
                  local_1d8[uVar17],(&local_198)[uVar17],uVar17 & 0xffffffff);
          pnga_error((char *)local_138,uVar17);
          lVar9 = local_1e8;
        }
        uVar17 = uVar17 + 1;
        lVar6 = local_158;
        g_a = local_1f0;
      } while ((long)uVar17 < (long)GA[lVar1].ndim);
    }
    pgVar7 = GA + lVar1;
    if (lVar9 == 0) {
      local_138[0] = (CONCAT44(local_198._4_4_,(int)local_198) - local_1d8[0]) +
                     pgVar7->width[0] * 2 + 1;
    }
    if ((short)lVar6 < 2) {
      lVar14 = 1;
      lVar13 = 0;
    }
    else {
      lVar14 = 1;
      lVar15 = 0;
      lVar13 = 0;
      do {
        lVar13 = lVar13 + ((GA[g_a + 1000].width[lVar15] + subscript[lVar15]) - local_1d8[lVar15]) *
                          lVar14;
        lVar16 = ((GA[g_a + 1000].width[lVar15] * 2 + 1) - local_1d8[lVar15]) + (&local_198)[lVar15]
        ;
        local_138[lVar15] = lVar16;
        lVar14 = lVar14 * lVar16;
        lVar15 = lVar15 + 1;
      } while (lVar9 != lVar15);
    }
    lVar13 = ((subscript[lVar6 + -1] - (long)(&local_1e0)[lVar6]) + pgVar7->width[lVar6 + -1]) *
             lVar14 + lVar13;
    if (pgVar7->p_handle == 0) {
      piVar10 = PGRP_LIST->inv_map_proc_list;
      CVar12 = pgVar7->rank_rstrctd[local_1f8];
LAB_001820eb:
      CVar12 = (long)piVar10[CVar12];
    }
    else {
      if (pgVar7->num_rstrctd == 0) {
        pCVar11 = pgVar7->rank_rstrctd;
        CVar12 = local_1f8;
      }
      else {
        pCVar11 = pgVar7->rstrctd_list;
        CVar12 = pgVar7->rank_rstrctd[local_1f8];
      }
LAB_001820fc:
      CVar12 = pCVar11[CVar12];
    }
  }
  local_1e0 = pgVar7->ptr[CVar12] + lVar13 * pgVar7->elemsize;
  inc = local_148;
LAB_00182118:
  iVar3 = GA[lVar1].type;
  if (GAme == local_1f8) {
    GAbytes.rdiloc = GAbytes.rdiloc + 8.0;
  }
  iVar4 = GA[lVar1].distr_type;
  if (iVar4 - 3U < 2) {
    sVar2 = GA[lVar1].ndim;
    uVar5 = (uint)sVar2;
    lVar6 = (long)(int)local_1f8 % GA[lVar1].num_blocks[0];
    local_1d8[0] = lVar6;
    if (1 < (int)uVar5) {
      lVar9 = 0;
      do {
        local_1f8 = ((int)local_1f8 - lVar6) / GA[g_a + 1000].num_blocks[lVar9];
        lVar6 = (long)(int)local_1f8 % GA[g_a + 1000].num_blocks[lVar9 + 1];
        local_1d8[lVar9 + 1] = lVar6;
        lVar9 = lVar9 + 1;
      } while ((ulong)uVar5 - 1 != lVar9);
    }
    lVar6 = local_150;
    if (0 < (short)local_150) {
      lVar9 = 0;
      do {
        local_1d8[lVar9] = local_1d8[lVar9] % (long)GA[g_a + 1000].nblock[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar6 != lVar9);
    }
    if (0 < sVar2) {
      uVar17 = 0;
      do {
        (&local_198)[uVar17] = local_1d8[uVar17] % (long)GA[g_a + 1000].nblock[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar5 != uVar17);
    }
    local_1f8 = (&lStack_1a0)[(int)uVar5];
    if (1 < sVar2) {
      uVar17 = (ulong)(uVar5 - 2);
      do {
        local_1f8 = local_1f8 * GA[g_a + 1000].nblock[uVar17] + (&local_198)[uVar17];
        bVar18 = 0 < (long)uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar18);
    }
  }
  else if (iVar4 == 2) {
    sVar2 = GA[lVar1].ndim;
    uVar5 = (uint)sVar2;
    lVar6 = (long)(int)local_1f8 % GA[lVar1].num_blocks[0];
    local_1d8[0] = lVar6;
    if (1 < (int)uVar5) {
      lVar9 = 0;
      do {
        local_1f8 = ((int)local_1f8 - lVar6) / GA[g_a + 1000].num_blocks[lVar9];
        lVar6 = (long)(int)local_1f8 % GA[g_a + 1000].num_blocks[lVar9 + 1];
        local_1d8[lVar9 + 1] = lVar6;
        lVar9 = lVar9 + 1;
      } while ((ulong)uVar5 - 1 != lVar9);
    }
    lVar6 = local_150;
    if (0 < (short)local_150) {
      lVar9 = 0;
      do {
        local_1d8[lVar9] = local_1d8[lVar9] % (long)GA[g_a + 1000].nblock[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar6 != lVar9);
    }
    if (0 < sVar2) {
      uVar17 = 0;
      do {
        (&local_198)[uVar17] = local_1d8[uVar17] % (long)GA[g_a + 1000].nblock[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar5 != uVar17);
    }
    local_1f8 = (&lStack_1a0)[(int)uVar5];
    if (1 < sVar2) {
      uVar17 = (ulong)(uVar5 - 2);
      do {
        local_1f8 = local_1f8 * GA[g_a + 1000].nblock[uVar17] + (&local_198)[uVar17];
        bVar18 = 0 < (long)uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar18);
    }
  }
  else if (iVar4 == 1) {
    IVar8 = pnga_nnodes();
    local_1f8 = local_1f8 % IVar8;
  }
  if ((int)local_140 != -1) {
    local_1f8 = (Integer)PGRP_LIST[local_140].inv_map_proc_list[local_1f8];
  }
  bVar18 = iVar3 == 0x3e9;
  ploc = local_1d8;
  if (bVar18) {
    ploc = &local_198;
  }
  ARMCI_Rmw(bVar18 ^ 0xd,ploc,local_1e0,(int)inc,(int)local_1f8);
  if (GA[lVar1].type == 0x3e9) {
    local_1d8[0] = (long)(int)local_198;
  }
  return local_1d8[0];
}

Assistant:

Integer pnga_read_inc(Integer g_a, Integer* subscript, Integer inc)
{
GA_Internal_Threadsafe_Lock();
char *ptr;
Integer ldp[MAXDIM], proc, handle=GA_OFFSET+g_a, p_handle, ndim;
int optype,ivalue;
long lvalue;
void *pval;

    ga_check_handleM(g_a, "nga_read_inc");
    
    /* BJP printf("p[%d] g_a: %d subscript: %d inc: %d\n",GAme, g_a, subscript[0], inc); */

    if(GA[handle].type!=C_INT && GA[handle].type!=C_LONG &&
       GA[handle].type!=C_LONGLONG)
       pnga_error("type must be integer",GA[handle].type);

    GAstat.numrdi++;
    GAbytes.rditot += (double)sizeof(Integer);
    p_handle = GA[handle].p_handle;
    ndim = GA[handle].ndim;

    /* find out who owns it */
    pnga_locate(g_a, subscript, &proc);

    /* get an address of the g_a(subscript) element */
    if (GA[handle].distr_type == REGULAR) {
      if (GA[handle].num_rstrctd == 0) {
        gam_Location(proc, handle,  subscript, (char**)&ptr, ldp);
      } else {
        gam_Location(GA[handle].rank_rstrctd[proc], handle,  subscript, (char**)&ptr, ldp);
      }
    } else {
      Integer lo[MAXDIM], hi[MAXDIM];
      Integer j, jtot, last, offset;
      pnga_distribution(g_a, proc, lo, hi);
      pnga_access_block_ptr(g_a, proc, (char**)&ptr, ldp);
      pnga_release_block(g_a, proc);
      offset = 0;
      last = ndim - 1;
      jtot = 1;
      for (j=0; j<last; j++) {
        offset += (subscript[j]-lo[j])*jtot;
        jtot *= ldp[j];
      }
      offset += (subscript[last]-lo[last])*jtot;
      ptr += offset*GA[handle].elemsize;
    }

    if(GA[handle].type==C_INT){
       optype = ARMCI_FETCH_AND_ADD;
       pval = &ivalue;
    }else{
       optype = ARMCI_FETCH_AND_ADD_LONG;
       pval = &lvalue;
    }

    if(GAme == proc)GAbytes.rdiloc += (double)sizeof(Integer);

    if (GA[handle].distr_type == BLOCK_CYCLIC) {
      proc = proc%pnga_nnodes();
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer j, index[MAXDIM];
      gam_find_block_indices(handle, proc, index);
      for (j=0; j<ndim; j++) {
        index[j] = index[j]%GA[handle].nblock[j];
      }
      gam_find_proc_from_sl_indices(handle,proc,index);
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer j, index[MAXDIM];
      gam_find_block_indices(handle, proc, index);
      for (j=0; j<ndim; j++) {
        index[j] = index[j]%GA[handle].nblock[j];
      }
      gam_find_tile_proc_from_indices(handle,proc,index);
    }
    if (p_handle != -1) {   
       proc=PGRP_LIST[p_handle].inv_map_proc_list[proc];
       /*printf("\n%d:proc=%d",GAme,proc);fflush(stdout);*/
    }

    ARMCI_Rmw(optype, pval, (int*)ptr, (int)inc, (int)proc);


   GA_Internal_Threadsafe_Unlock();
   if(GA[handle].type==C_INT)
       return (Integer) ivalue;
   else
       return (Integer) lvalue;
}